

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O1

bool NurbsCurveArc(ON_Arc *arc,int dim,ON_NurbsCurve *nurb)

{
  uint uVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  ON_3dPoint *pOVar5;
  double *pdVar6;
  ulong uVar7;
  double *pdVar8;
  int iVar9;
  ON_4dPoint *this;
  ON_4dPoint *pOVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double i;
  double knot [10];
  ON_3dPoint end_point;
  ON_3dPoint start_point;
  ON_Interval dom;
  ON_4dPoint CV [9];
  double local_228;
  double local_210;
  double local_208;
  double dStack_200;
  ON_3dPoint local_1f8;
  double local_1e0 [7];
  ON_3dPoint local_1a8;
  double local_188;
  ON_3dPoint local_180;
  ON_Interval local_168;
  ON_4dPoint local_158;
  ON_4dPoint local_138;
  ON_4dPoint local_118;
  ON_4dPoint local_f8;
  ON_4dPoint local_d8;
  ON_4dPoint local_b8;
  ON_4dPoint local_98;
  ON_4dPoint local_78;
  ON_4dPoint local_58;
  
  bVar3 = ON_Arc::IsValid(arc);
  if (!bVar3) {
    return bVar3;
  }
  pOVar5 = ON_Circle::Center(&arc->super_ON_Circle);
  local_208 = pOVar5->x;
  dVar2 = pOVar5->y;
  dVar16 = pOVar5->z;
  local_228 = ON_Arc::AngleRadians(arc);
  local_168 = ON_Arc::DomainRadians(arc);
  pdVar6 = ON_Interval::operator[](&local_168,0);
  dVar15 = *pdVar6;
  pdVar6 = ON_Interval::operator[](&local_168,1);
  local_188 = *pdVar6;
  ON_Arc::StartPoint(&local_180,arc);
  bVar4 = ON_Arc::IsCircle(arc);
  if (bVar4) {
    local_1a8.z = local_180.z;
    local_1a8.x = local_180.x;
    local_1a8.y = local_180.y;
  }
  else {
    ON_Arc::EndPoint(&local_1a8,arc);
  }
  iVar11 = 1;
  if ((1.570796373608275 < local_228) && (iVar11 = 2, 3.14159274721655 < local_228)) {
    iVar11 = 4;
  }
  ON_4dPoint::operator=(&local_158,&local_180);
  pOVar10 = &local_138;
  if (iVar11 == 2) {
    ON_Circle::PointAt(&local_1f8,&arc->super_ON_Circle,local_228 * 0.25 + dVar15);
    ON_4dPoint::operator=(pOVar10,&local_1f8);
    ON_Circle::PointAt(&local_1f8,&arc->super_ON_Circle,local_228 * 0.5 + dVar15);
    ON_4dPoint::operator=(&local_118,&local_1f8);
    ON_Circle::PointAt(&local_1f8,&arc->super_ON_Circle,local_228 * 0.75 + dVar15);
    ON_4dPoint::operator=(&local_f8,&local_1f8);
    this = &local_d8;
    local_228 = local_228 * 0.5;
  }
  else {
    if (iVar11 == 1) {
      ON_Circle::PointAt(&local_1f8,&arc->super_ON_Circle,local_228 * 0.5 + dVar15);
      ON_4dPoint::operator=(pOVar10,&local_1f8);
      ON_4dPoint::operator=(&local_118,&local_1a8);
      goto LAB_0038cf28;
    }
    ON_Circle::PointAt(&local_1f8,&arc->super_ON_Circle,local_228 * 0.125 + dVar15);
    ON_4dPoint::operator=(pOVar10,&local_1f8);
    ON_Circle::PointAt(&local_1f8,&arc->super_ON_Circle,local_228 * 0.25 + dVar15);
    ON_4dPoint::operator=(&local_118,&local_1f8);
    ON_Circle::PointAt(&local_1f8,&arc->super_ON_Circle,local_228 * 0.375 + dVar15);
    ON_4dPoint::operator=(&local_f8,&local_1f8);
    ON_Circle::PointAt(&local_1f8,&arc->super_ON_Circle,local_228 * 0.5 + dVar15);
    ON_4dPoint::operator=(&local_d8,&local_1f8);
    ON_Circle::PointAt(&local_1f8,&arc->super_ON_Circle,local_228 * 0.625 + dVar15);
    ON_4dPoint::operator=(&local_b8,&local_1f8);
    ON_Circle::PointAt(&local_1f8,&arc->super_ON_Circle,local_228 * 0.75 + dVar15);
    ON_4dPoint::operator=(&local_98,&local_1f8);
    ON_Circle::PointAt(&local_1f8,&arc->super_ON_Circle,local_228 * 0.875 + dVar15);
    ON_4dPoint::operator=(&local_78,&local_1f8);
    this = &local_58;
    local_228 = local_228 * 0.25;
  }
  ON_4dPoint::operator=(this,&local_1a8);
LAB_0038cf28:
  uVar1 = iVar11 * 2 + 1;
  dVar14 = cos(local_228 * 0.5);
  dVar17 = dVar14 + -1.0;
  local_1f8.y = dVar15;
  local_1f8.x = dVar15;
  uVar12 = (ulong)(uint)(iVar11 * 2);
  uVar7 = 1;
  do {
    pOVar10->x = pOVar10->x + local_208 * dVar17;
    pOVar10->y = pOVar10->y + dVar2 * dVar17;
    pOVar10->z = pOVar10->z + dVar17 * dVar16;
    pOVar10->w = dVar14;
    pOVar10[1].w = 1.0;
    dVar15 = (&dStack_200)[uVar7];
    local_1e0[uVar7 - 1] = dVar15 + local_228;
    local_1e0[uVar7 - 2] = dVar15 + local_228;
    uVar7 = uVar7 + 2;
    pOVar10 = pOVar10 + 2;
  } while (uVar7 < uVar12);
  (&local_1f8.x)[uVar1] = local_188;
  (&local_1f8.x)[uVar12] = local_188;
  uVar7 = 1;
  pOVar10 = &local_138;
  do {
    dVar2 = pOVar10->w;
    dVar15 = 1.0 / dVar2;
    local_208 = pOVar10->x * dVar15;
    dStack_200 = 0.0;
    dVar16 = modf(local_208 * 128.0,&local_210);
    dVar16 = (double)(~-(ulong)(dVar16 == 0.0) &
                      (~-(ulong)(2.2737367544323206e-13 < ABS(dVar16)) &
                       (ulong)(local_210 * 0.0078125) |
                      -(ulong)(2.2737367544323206e-13 < ABS(dVar16)) & (ulong)local_208) |
                     -(ulong)(dVar16 == 0.0) & (ulong)local_208);
    if ((local_208 != dVar16) || (NAN(local_208) || NAN(dVar16))) {
      pOVar10->x = dVar16 * dVar2;
    }
    local_208 = pOVar10->y * dVar15;
    dStack_200 = 0.0;
    dVar16 = modf(local_208 * 128.0,&local_210);
    dVar16 = (double)(~-(ulong)(dVar16 == 0.0) &
                      (~-(ulong)(2.2737367544323206e-13 < ABS(dVar16)) &
                       (ulong)(local_210 * 0.0078125) |
                      -(ulong)(2.2737367544323206e-13 < ABS(dVar16)) & (ulong)local_208) |
                     -(ulong)(dVar16 == 0.0) & (ulong)local_208);
    if ((local_208 != dVar16) || (NAN(local_208) || NAN(dVar16))) {
      pOVar10->y = dVar16 * dVar2;
    }
    dVar15 = dVar15 * pOVar10->z;
    dVar16 = modf(dVar15 * 128.0,&local_210);
    dVar16 = (double)(~-(ulong)(dVar16 == 0.0) &
                      (~-(ulong)(2.2737367544323206e-13 < ABS(dVar16)) &
                       (ulong)(local_210 * 0.0078125) |
                      -(ulong)(2.2737367544323206e-13 < ABS(dVar16)) & (ulong)dVar15) |
                     -(ulong)(dVar16 == 0.0) & (ulong)dVar15);
    if ((dVar15 != dVar16) || (NAN(dVar15) || NAN(dVar16))) {
      pOVar10->z = dVar2 * dVar16;
    }
    uVar7 = uVar7 + 2;
    pOVar10 = pOVar10 + 2;
  } while (uVar7 < uVar12);
  iVar9 = 4 - (uint)(dim == 2);
  nurb->m_dim = dim == 2 ^ 3;
  nurb->m_is_rat = 1;
  nurb->m_order = 3;
  nurb->m_cv_count = uVar1;
  nurb->m_cv_stride = iVar9;
  ON_NurbsCurve::ReserveCVCapacity(nurb,iVar9 * uVar1);
  ON_NurbsCurve::ReserveKnotCapacity(nurb,iVar11 * 2 + 2);
  pdVar6 = &local_158.w;
  lVar13 = 0;
  do {
    pdVar8 = ON_NurbsCurve::CV(nurb,(int)lVar13);
    *pdVar8 = ((ON_4dPoint *)(pdVar6 + -3))->x;
    pdVar8[1] = pdVar6[-2];
    if (dim == 2) {
      pdVar8[2] = *pdVar6;
    }
    else {
      pdVar8[2] = pdVar6[-1];
      pdVar8[3] = *pdVar6;
    }
    nurb->m_knot[lVar13] = (&local_1f8.x)[lVar13];
    lVar13 = lVar13 + 1;
    pdVar6 = pdVar6 + 4;
  } while (uVar12 + 1 != lVar13);
  *(undefined8 *)((long)nurb->m_knot + (ulong)(uVar1 * 8)) =
       *(undefined8 *)((long)&local_1f8.x + (ulong)(uVar1 * 8));
  return bVar3;
}

Assistant:

static bool NurbsCurveArc ( const ON_Arc& arc, int dim, ON_NurbsCurve& nurb )
{ 
  if ( !arc.IsValid() )
    return false;
  // makes a quadratic nurbs arc
  const ON_3dPoint center = arc.Center();
  double angle = arc.AngleRadians();
  ON_Interval dom = arc.DomainRadians();
  const double angle0 = dom[0];
  const double angle1 = dom[1];
  ON_3dPoint start_point = arc.StartPoint();
  //ON_3dPoint mid_point   = arc.PointAt(angle0 + 0.5*angle);
  ON_3dPoint end_point   = arc.IsCircle() ? start_point : arc.EndPoint();

  ON_4dPoint CV[9];
  double knot[10];

	double a, b, c, w, winv;
	double *cv;
	int    j, span_count, cv_count;

	a = (0.5 + ON_SQRT_EPSILON)*ON_PI;

	if (angle <= a)
		span_count = 1;
	else if (angle <= 2.0*a)
		span_count = 2;
	else if (angle <= 3.0*a)
		span_count = 4; // TODO - make a 3 span case
	else
		span_count = 4;

	cv_count = 2*span_count + 1;
	
	switch(span_count) {
	case 1:
    CV[0] = start_point;
    CV[1] = arc.PointAt(angle0 + 0.50*angle);
    CV[2] = end_point;
		break;
	case 2:
    CV[0] = start_point;
    CV[1] = arc.PointAt(angle0 + 0.25*angle);
    CV[2] = arc.PointAt(angle0 + 0.50*angle);
    CV[3] = arc.PointAt(angle0 + 0.75*angle);
    CV[4] = end_point;
		angle *= 0.5;
		break;
	default: // 4 spans
    CV[0] = start_point;
    CV[1] = arc.PointAt(angle0 + 0.125*angle);
    CV[2] = arc.PointAt(angle0 + 0.250*angle);
    CV[3] = arc.PointAt(angle0 + 0.375*angle);
    CV[4] = arc.PointAt(angle0 + 0.500*angle);
    CV[5] = arc.PointAt(angle0 + 0.625*angle);
    CV[6] = arc.PointAt(angle0 + 0.750*angle);
    CV[7] = arc.PointAt(angle0 + 0.875*angle);
    CV[8] = end_point;
		angle *= 0.25;
		break;
	}

	a = cos(0.5*angle);
	b = a - 1.0;
	//c = (radius > 0.0) ? radius*angle : angle;
  c = angle;

	span_count *= 2;
	knot[0] = knot[1] = angle0; //0.0;
	for (j = 1; j < span_count; j += 2) {
    CV[j].x += b * center.x;
    CV[j].y += b * center.y;
    CV[j].z += b * center.z;
    CV[j].w = a;
		CV[j+1].w = 1.0;
		knot[j+1] = knot[j+2] = knot[j-1] + c;
	}
  knot[cv_count-1] = knot[cv_count] = angle1;
  for ( j = 1; j < span_count; j += 2 ) {
    w = CV[j].w;
    winv = 1.0/w;
    a = CV[j].x*winv;
    b = ArcDeFuzz(a);
    if ( a != b ) {
      CV[j].x = b*w;
    }
    a = CV[j].y*winv;
    b = ArcDeFuzz(a);
    if ( a != b ) {
      CV[j].y = b*w;
    }
    a = CV[j].z*winv;
    b = ArcDeFuzz(a);
    if ( a != b ) {
      CV[j].z = b*w;
    }
  }

  nurb.m_dim = (dim==2) ? 2 : 3;
  nurb.m_is_rat = 1;
  nurb.m_order = 3;
  nurb.m_cv_count = cv_count;
  nurb.m_cv_stride = (dim==2 ? 3 : 4);
  nurb.ReserveCVCapacity( nurb.m_cv_stride*cv_count );
  nurb.ReserveKnotCapacity( cv_count+1 );
  for ( j = 0; j < cv_count; j++ ) {
    cv = nurb.CV(j);
    cv[0] = CV[j].x;
    cv[1] = CV[j].y;
    if ( dim == 2 ) {
      cv[2] = CV[j].w;
    }
    else {
      cv[2] = CV[j].z;
      cv[3] = CV[j].w;
    }
    nurb.m_knot[j] = knot[j];
  }
  nurb.m_knot[cv_count] = knot[cv_count];
  return true;
}